

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

size_t build_certificate_verify_signdata
                 (uint8_t *data,ptls_key_schedule_t *sched,char *context_string)

{
  st_ptls_hash_context_t *psVar1;
  size_t sVar2;
  ulong uVar3;
  
  builtin_memcpy(data,"                                                                ",0x40);
  sVar2 = strlen(context_string);
  memcpy(data + 0x40,context_string,sVar2 + 1);
  sVar2 = strlen(context_string);
  psVar1 = sched->hashes[0].ctx;
  (*psVar1->final)(psVar1,data + sVar2 + 0x41,PTLS_HASH_FINAL_MODE_SNAPSHOT);
  uVar3 = sVar2 + 0x41 + (sched->hashes[0].algo)->digest_size;
  if (uVar3 < 0xe3) {
    return uVar3;
  }
  __assert_fail("datalen <= PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                ,0x709,
                "size_t build_certificate_verify_signdata(uint8_t *, ptls_key_schedule_t *, const char *)"
               );
}

Assistant:

static size_t build_certificate_verify_signdata(uint8_t *data, ptls_key_schedule_t *sched, const char *context_string)
{
    size_t datalen = 0;

    memset(data + datalen, 32, 64);
    datalen += 64;
    memcpy(data + datalen, context_string, strlen(context_string) + 1);
    datalen += strlen(context_string) + 1;
    sched->hashes[0].ctx->final(sched->hashes[0].ctx, data + datalen, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    datalen += sched->hashes[0].algo->digest_size;
    assert(datalen <= PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE);

    return datalen;
}